

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigOrder.c
# Opt level: O3

void Aig_ManOrderStart(Aig_Man_t *p)

{
  int iVar1;
  void *pvVar2;
  uint *__s;
  int iVar3;
  long lVar4;
  Vec_Ptr_t *pVVar5;
  
  if (p->nObjs[4] != 0) {
    __assert_fail("Aig_ManBufNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigOrder.c"
                  ,0x31,"void Aig_ManOrderStart(Aig_Man_t *)");
  }
  if (p->pOrderData == (uint *)0x0) {
    pVVar5 = p->vObjs;
    iVar1 = pVVar5->nSize;
    iVar3 = 0x1000;
    if (0x7ff < iVar1) {
      iVar3 = iVar1 * 2;
    }
    p->nOrderAlloc = iVar3;
    __s = (uint *)malloc((long)(iVar3 * 2) << 2);
    p->pOrderData = __s;
    memset(__s,0xff,(long)iVar3 << 3);
    __s[0] = 0;
    __s[1] = 0;
    p->iPrev = 0;
    p->iNext = 0;
    if (0 < iVar1) {
      lVar4 = 0;
      do {
        pvVar2 = pVVar5->pArray[lVar4];
        if ((pvVar2 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar2 + 0x18) & 7) - 7)) {
          Aig_ObjOrderInsert(p,*(int *)((long)pvVar2 + 0x24));
          pVVar5 = p->vObjs;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < pVVar5->nSize);
    }
    return;
  }
  __assert_fail("p->pOrderData == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigOrder.c"
                ,0x33,"void Aig_ManOrderStart(Aig_Man_t *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Initializes the order datastructure.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Aig_ManOrderStart( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i;
    assert( Aig_ManBufNum(p) == 0 );
    // allocate order datastructure
    assert( p->pOrderData == NULL );
    p->nOrderAlloc = 2 * Aig_ManObjNumMax(p);
    if ( p->nOrderAlloc < (1<<12) )
        p->nOrderAlloc = (1<<12);
    p->pOrderData = ABC_ALLOC( unsigned, 2 * p->nOrderAlloc );
    memset( p->pOrderData, 0xFF, sizeof(unsigned) * 2 * p->nOrderAlloc );
    // add the constant node
    p->pOrderData[0] = p->pOrderData[1] = 0;
    p->iPrev = p->iNext = 0;
    // add the internal nodes
    Aig_ManForEachNode( p, pObj, i )
        Aig_ObjOrderInsert( p, pObj->Id );
}